

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_timesamples_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,TimeSamples *v,uint32_t indent)

{
  ulong uVar1;
  size_t sVar2;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar3;
  const_reference pvVar4;
  ostream *poVar5;
  uint32_t n;
  undefined1 in_R8B;
  string local_210;
  string local_1f0;
  string local_1d0;
  ulong local_1b0;
  size_t i;
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  TimeSamples *pTStack_18;
  uint32_t indent_local;
  TimeSamples *v_local;
  
  local_1c = (uint)v;
  pTStack_18 = (TimeSamples *)this;
  v_local = (TimeSamples *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  std::operator<<(aoStack_198,"{\n");
  local_1b0 = 0;
  while( true ) {
    uVar1 = local_1b0;
    sVar2 = value::TimeSamples::size(pTStack_18);
    if (sVar2 <= uVar1) break;
    pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)(local_1c + 1),n);
    std::operator<<(aoStack_198,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    pvVar3 = value::TimeSamples::get_samples(pTStack_18);
    pvVar4 = std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar3,local_1b0);
    poVar5 = (ostream *)std::ostream::operator<<(aoStack_198,pvVar4->t);
    poVar5 = std::operator<<(poVar5,": ");
    pvVar3 = value::TimeSamples::get_samples(pTStack_18);
    pvVar4 = std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](pvVar3,local_1b0);
    value::pprint_value_abi_cxx11_(&local_1f0,(value *)&pvVar4->value,(Value *)0x0,1,(bool)in_R8B);
    std::operator<<(poVar5,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::operator<<(aoStack_198,",\n");
    local_1b0 = local_1b0 + 1;
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)(ulong)local_1c,n);
  poVar5 = std::operator<<(aoStack_198,(string *)&local_210);
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string print_timesamples(const value::TimeSamples &v,
                              const uint32_t indent) {
  std::stringstream ss;

  ss << "{\n";

  for (size_t i = 0; i < v.size(); i++) {
    ss << pprint::Indent(indent + 1);
    ss << v.get_samples()[i].t << ": "
       << value::pprint_value(v.get_samples()[i].value);
    ss << ",\n";  // USDA allow ',' for the last item
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}